

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

bool __thiscall crnd::crn_unpacker::init_tables(crn_unpacker *this)

{
  symbol_codec *this_00;
  ushort uVar1;
  crn_header *pcVar2;
  short sVar3;
  bool bVar4;
  uint8 *puVar5;
  ushort uVar6;
  
  pcVar2 = this->m_pHeader;
  uVar6 = *(ushort *)(pcVar2->m_tables_size).m_buf;
  uVar6 = uVar6 << 8 | uVar6 >> 8;
  if (uVar6 == 0) {
    return false;
  }
  this_00 = &this->m_codec;
  puVar5 = this->m_pData +
           ((ulong)(pcVar2->m_tables_ofs).m_buf[2] |
           (ulong)((uint)(pcVar2->m_tables_ofs).m_buf[0] << 0x10 |
                  (uint)(pcVar2->m_tables_ofs).m_buf[1] << 8));
  (this->m_codec).m_pDecode_buf = puVar5;
  (this->m_codec).m_pDecode_buf_next = puVar5;
  (this->m_codec).m_decode_buf_size = (uint)uVar6;
  (this->m_codec).m_pDecode_buf_end = puVar5 + (uint)uVar6;
  (this->m_codec).m_bit_buf = 0;
  (this->m_codec).m_bit_count = 0;
  bVar4 = symbol_codec::decode_receive_static_data_model(this_00,&this->m_reference_encoding_dm);
  if (!bVar4) {
    return false;
  }
  uVar6 = *(ushort *)(this->m_pHeader->m_color_endpoints).m_num.m_buf;
  sVar3 = uVar6 << 8;
  uVar6 = uVar6 >> 8;
  if (sVar3 == 0 && uVar6 == 0) {
    uVar1 = *(ushort *)(this->m_pHeader->m_alpha_endpoints).m_num.m_buf;
    if ((uVar1 & 0xff) == 0 && uVar1 >> 8 == 0) {
      return false;
    }
    if (sVar3 == 0 && uVar6 == 0) goto LAB_001130f2;
  }
  bVar4 = symbol_codec::decode_receive_static_data_model(this_00,this->m_endpoint_delta_dm);
  if (!bVar4) {
    return false;
  }
  bVar4 = symbol_codec::decode_receive_static_data_model(this_00,this->m_selector_delta_dm);
  if (!bVar4) {
    return false;
  }
LAB_001130f2:
  uVar6 = *(ushort *)(this->m_pHeader->m_alpha_endpoints).m_num.m_buf;
  if (((uVar6 & 0xff) != 0 || uVar6 >> 8 != 0) &&
     ((bVar4 = symbol_codec::decode_receive_static_data_model(this_00,this->m_endpoint_delta_dm + 1)
      , !bVar4 ||
      (bVar4 = symbol_codec::decode_receive_static_data_model(this_00,this->m_selector_delta_dm + 1)
      , !bVar4)))) {
    return false;
  }
  return true;
}

Assistant:

bool init_tables()
        {
            if (!m_codec.start_decoding(m_pData + m_pHeader->m_tables_ofs, m_pHeader->m_tables_size))
                return false;

            if (!m_codec.decode_receive_static_data_model(m_reference_encoding_dm))
                return false;

            if ((!m_pHeader->m_color_endpoints.m_num) && (!m_pHeader->m_alpha_endpoints.m_num))
                return false;

            if (m_pHeader->m_color_endpoints.m_num)
            {
                if (!m_codec.decode_receive_static_data_model(m_endpoint_delta_dm[0]))
                    return false;
                if (!m_codec.decode_receive_static_data_model(m_selector_delta_dm[0]))
                    return false;
            }

            if (m_pHeader->m_alpha_endpoints.m_num)
            {
                if (!m_codec.decode_receive_static_data_model(m_endpoint_delta_dm[1]))
                    return false;
                if (!m_codec.decode_receive_static_data_model(m_selector_delta_dm[1]))
                    return false;
            }

            m_codec.stop_decoding();

            return true;
        }